

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readPrefixes(InternalInstruction *insn)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  uint8_t opcodeByte;
  uint8_t byte1_3;
  uint8_t byte1_2;
  uint8_t byte1_1;
  uint8_t byte2;
  uint8_t byte1;
  _Bool hasOpSize;
  _Bool hasAdSize;
  uint8_t nextByte;
  uint8_t byte;
  uint64_t prefixLocation;
  InternalInstruction *pIStack_18;
  _Bool isPrefix;
  InternalInstruction *insn_local;
  
  prefixLocation._7_1_ = 1;
  byte1_3 = '\0';
  local_2b = 0;
  local_2c = 0;
  pIStack_18 = insn;
  while ((prefixLocation._7_1_ & 1) != 0) {
    if (pIStack_18->mode == MODE_64BIT) {
      iVar2 = consumeByte(pIStack_18,&byte1_3);
      if (iVar2 != 0) {
        return -1;
      }
      if ((byte1_3 & 0xf0) == 0x40) {
        while( true ) {
          iVar2 = lookAtByte(pIStack_18,&byte1_3);
          if (iVar2 != 0) {
            return -1;
          }
          if ((byte1_3 & 0xf0) != 0x40) break;
          iVar2 = consumeByte(pIStack_18,&byte1_3);
          if (iVar2 != 0) {
            return -1;
          }
        }
        uVar3 = (uint)byte1_3;
        if ((((uVar3 != 0x26) && (uVar3 != 0x2e)) && (uVar3 != 0x36)) &&
           (((uVar3 != 0x3e && (3 < uVar3 - 100)) &&
            ((uVar3 != 0xf0 && (uVar3 != 0xf2 && uVar3 != 0xf3)))))) {
          unconsumeByte(pIStack_18);
        }
      }
      else {
        unconsumeByte(pIStack_18);
      }
    }
    _byte1_2 = pIStack_18->readerCursor;
    iVar2 = consumeByte(pIStack_18,&byte1_3);
    if (iVar2 != 0) {
      return -1;
    }
    if ((pIStack_18->readerCursor - 1 == pIStack_18->startLocation) &&
       ((byte1_3 == 0xf2 || (byte1_3 == 0xf3)))) {
      iVar2 = lookAtByte(pIStack_18,&opcodeByte);
      if (iVar2 != 0) {
        return -1;
      }
      if (((byte1_3 == 0xf2) || (byte1_3 == 0xf3)) &&
         (opcodeByte == 0xf0 || ((opcodeByte & 0xfe) == 0x86 || (opcodeByte & 0xf8) == 0x90))) {
        pIStack_18->xAcquireRelease = true;
      }
      if ((byte1_3 == 0xf3) &&
         (((opcodeByte == 0x88 || (opcodeByte == 0x89)) ||
          ((opcodeByte == 0xc6 || (opcodeByte == 199)))))) {
        pIStack_18->xAcquireRelease = true;
      }
      if ((pIStack_18->mode == MODE_64BIT) && ((opcodeByte & 0xf0) == 0x40)) {
        iVar2 = consumeByte(pIStack_18,&opcodeByte);
        if (iVar2 != 0) {
          return -1;
        }
        iVar2 = lookAtByte(pIStack_18,&opcodeByte);
        if (iVar2 != 0) {
          return -1;
        }
        unconsumeByte(pIStack_18);
      }
    }
    if (byte1_3 == '&') {
      pIStack_18->segmentOverride = SEG_OVERRIDE_ES;
      pIStack_18->isPrefix2e = false;
      pIStack_18->isPrefix36 = false;
      pIStack_18->isPrefix3e = false;
      pIStack_18->isPrefix26 = false;
      pIStack_18->isPrefix64 = false;
      pIStack_18->isPrefix65 = false;
      setPrefixPresent(pIStack_18,'&',_byte1_2);
      pIStack_18->prefix1 = byte1_3;
    }
    else if (byte1_3 == '.') {
      pIStack_18->segmentOverride = SEG_OVERRIDE_CS;
      pIStack_18->isPrefix2e = false;
      pIStack_18->isPrefix36 = false;
      pIStack_18->isPrefix3e = false;
      pIStack_18->isPrefix26 = false;
      pIStack_18->isPrefix64 = false;
      pIStack_18->isPrefix65 = false;
      setPrefixPresent(pIStack_18,'.',_byte1_2);
      pIStack_18->prefix1 = byte1_3;
    }
    else if (byte1_3 == '6') {
      pIStack_18->segmentOverride = SEG_OVERRIDE_SS;
      pIStack_18->isPrefix2e = false;
      pIStack_18->isPrefix36 = false;
      pIStack_18->isPrefix3e = false;
      pIStack_18->isPrefix26 = false;
      pIStack_18->isPrefix64 = false;
      pIStack_18->isPrefix65 = false;
      setPrefixPresent(pIStack_18,'6',_byte1_2);
      pIStack_18->prefix1 = byte1_3;
    }
    else if (byte1_3 == '>') {
      pIStack_18->segmentOverride = SEG_OVERRIDE_DS;
      pIStack_18->isPrefix2e = false;
      pIStack_18->isPrefix36 = false;
      pIStack_18->isPrefix3e = false;
      pIStack_18->isPrefix26 = false;
      pIStack_18->isPrefix64 = false;
      pIStack_18->isPrefix65 = false;
      setPrefixPresent(pIStack_18,'>',_byte1_2);
      pIStack_18->prefix1 = byte1_3;
    }
    else if (byte1_3 == 'd') {
      pIStack_18->segmentOverride = SEG_OVERRIDE_FS;
      pIStack_18->isPrefix2e = false;
      pIStack_18->isPrefix36 = false;
      pIStack_18->isPrefix3e = false;
      pIStack_18->isPrefix26 = false;
      pIStack_18->isPrefix64 = false;
      pIStack_18->isPrefix65 = false;
      setPrefixPresent(pIStack_18,'d',_byte1_2);
      pIStack_18->prefix1 = byte1_3;
    }
    else if (byte1_3 == 'e') {
      pIStack_18->segmentOverride = SEG_OVERRIDE_GS;
      pIStack_18->isPrefix2e = false;
      pIStack_18->isPrefix36 = false;
      pIStack_18->isPrefix3e = false;
      pIStack_18->isPrefix26 = false;
      pIStack_18->isPrefix64 = false;
      pIStack_18->isPrefix65 = false;
      setPrefixPresent(pIStack_18,'e',_byte1_2);
      pIStack_18->prefix1 = byte1_3;
    }
    else if (byte1_3 == 'f') {
      local_2c = 1;
      setPrefixPresent(pIStack_18,'f',_byte1_2);
      pIStack_18->prefix2 = byte1_3;
    }
    else if (byte1_3 == 'g') {
      local_2b = 1;
      setPrefixPresent(pIStack_18,'g',_byte1_2);
      pIStack_18->prefix3 = byte1_3;
    }
    else if ((byte1_3 == 0xf0) || (byte1_3 == 0xf2 || byte1_3 == 0xf3)) {
      pIStack_18->isPrefixf2 = false;
      pIStack_18->isPrefixf3 = false;
      pIStack_18->isPrefixf0 = false;
      setPrefixPresent(pIStack_18,byte1_3,_byte1_2);
      pIStack_18->prefix0 = byte1_3;
    }
    else {
      prefixLocation._7_1_ = 0;
    }
  }
  pIStack_18->vectorExtensionType = TYPE_NO_VEX_XOP;
  if (byte1_3 == 'b') {
    iVar2 = consumeByte(pIStack_18,&local_2d);
    if (iVar2 != 0) {
      return -1;
    }
    if (((pIStack_18->mode == MODE_64BIT) || ((local_2d & 0xc0) == 0xc0)) &&
       (((local_2d ^ 0xff) & 0xc) == 0xc)) {
      iVar2 = lookAtByte(pIStack_18,&local_2e);
      if (iVar2 != 0) {
        return -1;
      }
      if ((local_2e & 4) == 4) {
        pIStack_18->vectorExtensionType = TYPE_EVEX;
      }
      else {
        unconsumeByte(pIStack_18);
        unconsumeByte(pIStack_18);
        pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 2;
      }
      if (pIStack_18->vectorExtensionType == TYPE_EVEX) {
        pIStack_18->vectorExtensionPrefix[0] = byte1_3;
        pIStack_18->vectorExtensionPrefix[1] = local_2d;
        iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 2);
        if (iVar2 != 0) {
          return -1;
        }
        iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 3);
        if (iVar2 != 0) {
          return -1;
        }
        if (pIStack_18->mode == MODE_64BIT) {
          pIStack_18->rexPrefix =
               (byte)(((int)(pIStack_18->vectorExtensionPrefix[2] & 0x80) >> 7) << 3) | 0x40 |
               (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x80) >> 7) << 2)
               | (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x40) >> 6) <<
                       1) |
               (byte)((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x20) >> 5);
        }
      }
    }
    else {
      unconsumeByte(pIStack_18);
      unconsumeByte(pIStack_18);
    }
  }
  else if (byte1_3 == 0xc4) {
    iVar2 = lookAtByte(pIStack_18,&local_2f);
    if (iVar2 != 0) {
      return -1;
    }
    if ((pIStack_18->mode == MODE_64BIT) || ((local_2f & 0xc0) == 0xc0)) {
      pIStack_18->vectorExtensionType = TYPE_VEX_3B;
      pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 1;
    }
    else {
      unconsumeByte(pIStack_18);
      pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 1;
    }
    if (pIStack_18->vectorExtensionType == TYPE_VEX_3B) {
      pIStack_18->vectorExtensionPrefix[0] = byte1_3;
      iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 1);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 2);
      if (iVar2 != 0) {
        return -1;
      }
      if (pIStack_18->mode == MODE_64BIT) {
        pIStack_18->rexPrefix =
             (byte)(((int)(pIStack_18->vectorExtensionPrefix[2] & 0x80) >> 7) << 3) | 0x40 |
             (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x80) >> 7) << 2) |
             (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x40) >> 6) << 1) |
             (byte)((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x20) >> 5);
      }
    }
  }
  else if (byte1_3 == 0xc5) {
    iVar2 = lookAtByte(pIStack_18,&local_30);
    if (iVar2 != 0) {
      return -1;
    }
    if ((pIStack_18->mode == MODE_64BIT) || ((local_30 & 0xc0) == 0xc0)) {
      pIStack_18->vectorExtensionType = TYPE_VEX_2B;
    }
    else {
      unconsumeByte(pIStack_18);
    }
    if (pIStack_18->vectorExtensionType == TYPE_VEX_2B) {
      pIStack_18->vectorExtensionPrefix[0] = byte1_3;
      iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 1);
      if (iVar2 != 0) {
        return -1;
      }
      if (pIStack_18->mode == MODE_64BIT) {
        pIStack_18->rexPrefix =
             (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x80) >> 7) << 2) |
             0x40;
      }
      if ((pIStack_18->vectorExtensionPrefix[1] & 3) == 1) {
        local_2c = 1;
      }
    }
  }
  else if (byte1_3 == 0x8f) {
    iVar2 = lookAtByte(pIStack_18,&local_31);
    if (iVar2 != 0) {
      return -1;
    }
    if ((local_31 & 0x38) == 0) {
      unconsumeByte(pIStack_18);
      pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 1;
    }
    else {
      pIStack_18->vectorExtensionType = TYPE_XOP;
      pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 1;
    }
    if (pIStack_18->vectorExtensionType == TYPE_XOP) {
      pIStack_18->vectorExtensionPrefix[0] = byte1_3;
      iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 1);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = consumeByte(pIStack_18,pIStack_18->vectorExtensionPrefix + 2);
      if (iVar2 != 0) {
        return -1;
      }
      if (pIStack_18->mode == MODE_64BIT) {
        pIStack_18->rexPrefix =
             (byte)(((int)(pIStack_18->vectorExtensionPrefix[2] & 0x80) >> 7) << 3) | 0x40 |
             (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x80) >> 7) << 2) |
             (byte)(((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x40) >> 6) << 1) |
             (byte)((int)((pIStack_18->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x20) >> 5);
      }
      if ((pIStack_18->vectorExtensionPrefix[2] & 3) == 1) {
        local_2c = 1;
      }
    }
  }
  else if (pIStack_18->mode == MODE_64BIT) {
    if ((byte1_3 & 0xf0) == 0x40) {
      while( true ) {
        iVar2 = lookAtByte(pIStack_18,&local_32);
        if (iVar2 != 0) {
          return -1;
        }
        if ((local_32 & 0xf0) != 0x40) break;
        iVar2 = consumeByte(pIStack_18,&byte1_3);
        if (iVar2 != 0) {
          return -1;
        }
      }
      pIStack_18->rexPrefix = byte1_3;
      pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 2;
    }
    else {
      unconsumeByte(pIStack_18);
      pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 1;
    }
  }
  else {
    unconsumeByte(pIStack_18);
    pIStack_18->necessaryPrefixLocation = pIStack_18->readerCursor - 1;
  }
  if (pIStack_18->mode == MODE_16BIT) {
    uVar1 = '\x02';
    if ((local_2c & 1) != 0) {
      uVar1 = '\x04';
    }
    pIStack_18->registerSize = uVar1;
    uVar1 = '\x02';
    if ((local_2b & 1) != 0) {
      uVar1 = '\x04';
    }
    pIStack_18->addressSize = uVar1;
    uVar1 = '\x02';
    if ((local_2b & 1) != 0) {
      uVar1 = '\x04';
    }
    pIStack_18->displacementSize = uVar1;
    uVar1 = '\x02';
    if ((local_2c & 1) != 0) {
      uVar1 = '\x04';
    }
    pIStack_18->immediateSize = uVar1;
    uVar1 = '\x02';
    if ((local_2c & 1) != 0) {
      uVar1 = '\x04';
    }
    pIStack_18->immSize = uVar1;
  }
  else if (pIStack_18->mode == MODE_32BIT) {
    uVar1 = '\x04';
    if ((local_2c & 1) != 0) {
      uVar1 = '\x02';
    }
    pIStack_18->registerSize = uVar1;
    uVar1 = '\x04';
    if ((local_2b & 1) != 0) {
      uVar1 = '\x02';
    }
    pIStack_18->addressSize = uVar1;
    uVar1 = '\x04';
    if ((local_2b & 1) != 0) {
      uVar1 = '\x02';
    }
    pIStack_18->displacementSize = uVar1;
    uVar1 = '\x04';
    if ((local_2c & 1) != 0) {
      uVar1 = '\x02';
    }
    pIStack_18->immediateSize = uVar1;
    uVar1 = '\x04';
    if ((local_2c & 1) != 0) {
      uVar1 = '\x02';
    }
    pIStack_18->immSize = uVar1;
  }
  else if (pIStack_18->mode == MODE_64BIT) {
    if ((pIStack_18->rexPrefix == '\0') || ((int)(pIStack_18->rexPrefix & 8) >> 3 == 0)) {
      if (pIStack_18->rexPrefix == '\0') {
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->registerSize = uVar1;
        uVar1 = '\b';
        if ((local_2b & 1) != 0) {
          uVar1 = '\x04';
        }
        pIStack_18->addressSize = uVar1;
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->displacementSize = uVar1;
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->immediateSize = uVar1;
        uVar1 = '\b';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x04';
        }
        pIStack_18->immSize = uVar1;
      }
      else {
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->registerSize = uVar1;
        uVar1 = '\b';
        if ((local_2b & 1) != 0) {
          uVar1 = '\x04';
        }
        pIStack_18->addressSize = uVar1;
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->displacementSize = uVar1;
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->immediateSize = uVar1;
        uVar1 = '\x04';
        if ((local_2c & 1) != 0) {
          uVar1 = '\x02';
        }
        pIStack_18->immSize = uVar1;
      }
    }
    else {
      pIStack_18->registerSize = '\b';
      uVar1 = '\b';
      if ((local_2b & 1) != 0) {
        uVar1 = '\x04';
      }
      pIStack_18->addressSize = uVar1;
      pIStack_18->displacementSize = '\x04';
      pIStack_18->immediateSize = '\x04';
      pIStack_18->immSize = '\x04';
    }
  }
  return 0;
}

Assistant:

static int readPrefixes(struct InternalInstruction *insn)
{
	bool isPrefix = true;
	uint64_t prefixLocation;
	uint8_t byte = 0, nextByte;

	bool hasAdSize = false;
	bool hasOpSize = false;

	while (isPrefix) {
		if (insn->mode == MODE_64BIT) {
			// eliminate consecutive redundant REX bytes in front
			if (consumeByte(insn, &byte))
				return -1;

			if ((byte & 0xf0) == 0x40) {
				while(true) {
					if (lookAtByte(insn, &byte))	// out of input code
						return -1;
					if ((byte & 0xf0) == 0x40) {
						// another REX prefix, but we only remember the last one
						if (consumeByte(insn, &byte))
							return -1;
					} else
						break;
				}

				// recover the last REX byte if next byte is not a legacy prefix
				switch (byte) {
					case 0xf2:  /* REPNE/REPNZ */
					case 0xf3:  /* REP or REPE/REPZ */
					case 0xf0:  /* LOCK */
					case 0x2e:  /* CS segment override -OR- Branch not taken */
					case 0x36:  /* SS segment override -OR- Branch taken */
					case 0x3e:  /* DS segment override */
					case 0x26:  /* ES segment override */
					case 0x64:  /* FS segment override */
					case 0x65:  /* GS segment override */
					case 0x66:  /* Operand-size override */
					case 0x67:  /* Address-size override */
						break;
					default:    /* Not a prefix byte */
						unconsumeByte(insn);
						break;
				}
			} else {
				unconsumeByte(insn);
			}
		}

		prefixLocation = insn->readerCursor;

		/* If we fail reading prefixes, just stop here and let the opcode reader deal with it */
		if (consumeByte(insn, &byte))
			return -1;

		if (insn->readerCursor - 1 == insn->startLocation
				&& (byte == 0xf2 || byte == 0xf3)) {

			if (lookAtByte(insn, &nextByte))
				return -1;

			/*
			 * If the byte is 0xf2 or 0xf3, and any of the following conditions are
			 * met:
			 * - it is followed by a LOCK (0xf0) prefix
			 * - it is followed by an xchg instruction
			 * then it should be disassembled as a xacquire/xrelease not repne/rep.
			 */
			if ((byte == 0xf2 || byte == 0xf3) &&
					((nextByte == 0xf0) |
					 ((nextByte & 0xfe) == 0x86 || (nextByte & 0xf8) == 0x90)))
				insn->xAcquireRelease = true;
			/*
			 * Also if the byte is 0xf3, and the following condition is met:
			 * - it is followed by a "mov mem, reg" (opcode 0x88/0x89) or
			 *                       "mov mem, imm" (opcode 0xc6/0xc7) instructions.
			 * then it should be disassembled as an xrelease not rep.
			 */
			if (byte == 0xf3 &&
					(nextByte == 0x88 || nextByte == 0x89 ||
					 nextByte == 0xc6 || nextByte == 0xc7))
				insn->xAcquireRelease = true;

			if (insn->mode == MODE_64BIT && (nextByte & 0xf0) == 0x40) {
				if (consumeByte(insn, &nextByte))
					return -1;
				if (lookAtByte(insn, &nextByte))
					return -1;
				unconsumeByte(insn);
			}
		}

		switch (byte) {
			case 0xf2:  /* REPNE/REPNZ */
			case 0xf3:  /* REP or REPE/REPZ */
			case 0xf0:  /* LOCK */
				// only accept the last prefix
				insn->isPrefixf2 = false;
				insn->isPrefixf3 = false;
				insn->isPrefixf0 = false;
				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix0 = byte;
				break;
			case 0x2e:  /* CS segment override -OR- Branch not taken */
				insn->segmentOverride = SEG_OVERRIDE_CS;
				// only accept the last prefix
				insn->isPrefix2e = false;
				insn->isPrefix36 = false;
				insn->isPrefix3e = false;
				insn->isPrefix26 = false;
				insn->isPrefix64 = false;
				insn->isPrefix65 = false;

				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix1 = byte;
				break;
			case 0x36:  /* SS segment override -OR- Branch taken */
				insn->segmentOverride = SEG_OVERRIDE_SS;
				// only accept the last prefix
				insn->isPrefix2e = false;
				insn->isPrefix36 = false;
				insn->isPrefix3e = false;
				insn->isPrefix26 = false;
				insn->isPrefix64 = false;
				insn->isPrefix65 = false;

				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix1 = byte;
				break;
			case 0x3e:  /* DS segment override */
				insn->segmentOverride = SEG_OVERRIDE_DS;
				// only accept the last prefix
				insn->isPrefix2e = false;
				insn->isPrefix36 = false;
				insn->isPrefix3e = false;
				insn->isPrefix26 = false;
				insn->isPrefix64 = false;
				insn->isPrefix65 = false;

				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix1 = byte;
				break;
			case 0x26:  /* ES segment override */
				insn->segmentOverride = SEG_OVERRIDE_ES;
				// only accept the last prefix
				insn->isPrefix2e = false;
				insn->isPrefix36 = false;
				insn->isPrefix3e = false;
				insn->isPrefix26 = false;
				insn->isPrefix64 = false;
				insn->isPrefix65 = false;

				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix1 = byte;
				break;
			case 0x64:  /* FS segment override */
				insn->segmentOverride = SEG_OVERRIDE_FS;
				// only accept the last prefix
				insn->isPrefix2e = false;
				insn->isPrefix36 = false;
				insn->isPrefix3e = false;
				insn->isPrefix26 = false;
				insn->isPrefix64 = false;
				insn->isPrefix65 = false;

				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix1 = byte;
				break;
			case 0x65:  /* GS segment override */
				insn->segmentOverride = SEG_OVERRIDE_GS;
				// only accept the last prefix
				insn->isPrefix2e = false;
				insn->isPrefix36 = false;
				insn->isPrefix3e = false;
				insn->isPrefix26 = false;
				insn->isPrefix64 = false;
				insn->isPrefix65 = false;

				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix1 = byte;
				break;
			case 0x66:  /* Operand-size override */
				hasOpSize = true;
				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix2 = byte;
				break;
			case 0x67:  /* Address-size override */
				hasAdSize = true;
				setPrefixPresent(insn, byte, prefixLocation);
				insn->prefix3 = byte;
				break;
			default:    /* Not a prefix byte */
				isPrefix = false;
				break;
		}

		//if (isPrefix)
		//	dbgprintf(insn, "Found prefix 0x%hhx", byte);
	}

	insn->vectorExtensionType = TYPE_NO_VEX_XOP;


	if (byte == 0x62) {
		uint8_t byte1, byte2;

		if (consumeByte(insn, &byte1)) {
			//dbgprintf(insn, "Couldn't read second byte of EVEX prefix");
			return -1;
		}

		if ((insn->mode == MODE_64BIT || (byte1 & 0xc0) == 0xc0) &&
				((~byte1 & 0xc) == 0xc)) {
			if (lookAtByte(insn, &byte2)) {
				//dbgprintf(insn, "Couldn't read third byte of EVEX prefix");
				return -1;
			}

			if ((byte2 & 0x4) == 0x4) {
				insn->vectorExtensionType = TYPE_EVEX;
			} else {
				unconsumeByte(insn); /* unconsume byte1 */
				unconsumeByte(insn); /* unconsume byte  */
				insn->necessaryPrefixLocation = insn->readerCursor - 2;
			}

			if (insn->vectorExtensionType == TYPE_EVEX) {
				insn->vectorExtensionPrefix[0] = byte;
				insn->vectorExtensionPrefix[1] = byte1;

				if (consumeByte(insn, &insn->vectorExtensionPrefix[2])) {
					//dbgprintf(insn, "Couldn't read third byte of EVEX prefix");
					return -1;
				}

				if (consumeByte(insn, &insn->vectorExtensionPrefix[3])) {
					//dbgprintf(insn, "Couldn't read fourth byte of EVEX prefix");
					return -1;
				}

				/* We simulate the REX prefix for simplicity's sake */
				if (insn->mode == MODE_64BIT) {
					insn->rexPrefix = 0x40
						| (wFromEVEX3of4(insn->vectorExtensionPrefix[2]) << 3)
						| (rFromEVEX2of4(insn->vectorExtensionPrefix[1]) << 2)
						| (xFromEVEX2of4(insn->vectorExtensionPrefix[1]) << 1)
						| (bFromEVEX2of4(insn->vectorExtensionPrefix[1]) << 0);
				}

				//dbgprintf(insn, "Found EVEX prefix 0x%hhx 0x%hhx 0x%hhx 0x%hhx",
				//		insn->vectorExtensionPrefix[0], insn->vectorExtensionPrefix[1],
				//		insn->vectorExtensionPrefix[2], insn->vectorExtensionPrefix[3]);
			}
		} else {
			// BOUND instruction
			unconsumeByte(insn); /* unconsume byte1 */
			unconsumeByte(insn); /* unconsume byte */
		}
	} else if (byte == 0xc4) {
		uint8_t byte1;

		if (lookAtByte(insn, &byte1)) {
			//dbgprintf(insn, "Couldn't read second byte of VEX");
			return -1;
		}

		if (insn->mode == MODE_64BIT || (byte1 & 0xc0) == 0xc0) {
			insn->vectorExtensionType = TYPE_VEX_3B;
			insn->necessaryPrefixLocation = insn->readerCursor - 1;
		} else {
			unconsumeByte(insn);
			insn->necessaryPrefixLocation = insn->readerCursor - 1;
		}

		if (insn->vectorExtensionType == TYPE_VEX_3B) {
			insn->vectorExtensionPrefix[0] = byte;
			if (consumeByte(insn, &insn->vectorExtensionPrefix[1]))
				return -1;
			if (consumeByte(insn, &insn->vectorExtensionPrefix[2]))
				return -1;

			/* We simulate the REX prefix for simplicity's sake */
			if (insn->mode == MODE_64BIT) {
				insn->rexPrefix = 0x40
					| (wFromVEX3of3(insn->vectorExtensionPrefix[2]) << 3)
					| (rFromVEX2of3(insn->vectorExtensionPrefix[1]) << 2)
					| (xFromVEX2of3(insn->vectorExtensionPrefix[1]) << 1)
					| (bFromVEX2of3(insn->vectorExtensionPrefix[1]) << 0);

			}
		}
	} else if (byte == 0xc5) {
		uint8_t byte1;

		if (lookAtByte(insn, &byte1)) {
			//dbgprintf(insn, "Couldn't read second byte of VEX");
			return -1;
		}

		if (insn->mode == MODE_64BIT || (byte1 & 0xc0) == 0xc0) {
			insn->vectorExtensionType = TYPE_VEX_2B;
		} else {
			unconsumeByte(insn);
		}

		if (insn->vectorExtensionType == TYPE_VEX_2B) {
			insn->vectorExtensionPrefix[0] = byte;
			if (consumeByte(insn, &insn->vectorExtensionPrefix[1]))
				return -1;

			if (insn->mode == MODE_64BIT) {
				insn->rexPrefix = 0x40
					| (rFromVEX2of2(insn->vectorExtensionPrefix[1]) << 2);
			}

			switch (ppFromVEX2of2(insn->vectorExtensionPrefix[1])) {
				default:
					break;
				case VEX_PREFIX_66:
					hasOpSize = true;
					break;
			}
		}
	} else if (byte == 0x8f) {
		uint8_t byte1;

		if (lookAtByte(insn, &byte1)) {
			// dbgprintf(insn, "Couldn't read second byte of XOP");
			return -1;
		}

		if ((byte1 & 0x38) != 0x0) { /* 0 in these 3 bits is a POP instruction. */
			insn->vectorExtensionType = TYPE_XOP;
			insn->necessaryPrefixLocation = insn->readerCursor - 1;
		} else {
			unconsumeByte(insn);
			insn->necessaryPrefixLocation = insn->readerCursor - 1;
		}

		if (insn->vectorExtensionType == TYPE_XOP) {
			insn->vectorExtensionPrefix[0] = byte;
			if (consumeByte(insn, &insn->vectorExtensionPrefix[1]))
				return -1;
			if (consumeByte(insn, &insn->vectorExtensionPrefix[2]))
				return -1;

			/* We simulate the REX prefix for simplicity's sake */
			if (insn->mode == MODE_64BIT) {
				insn->rexPrefix = 0x40
					| (wFromXOP3of3(insn->vectorExtensionPrefix[2]) << 3)
					| (rFromXOP2of3(insn->vectorExtensionPrefix[1]) << 2)
					| (xFromXOP2of3(insn->vectorExtensionPrefix[1]) << 1)
					| (bFromXOP2of3(insn->vectorExtensionPrefix[1]) << 0);
			}

			switch (ppFromXOP3of3(insn->vectorExtensionPrefix[2])) {
				default:
					break;
				case VEX_PREFIX_66:
					hasOpSize = true;
					break;
			}
		}
	} else {
		if (insn->mode == MODE_64BIT) {
			if ((byte & 0xf0) == 0x40) {
				uint8_t opcodeByte;

				while(true) {
					if (lookAtByte(insn, &opcodeByte))	// out of input code
						return -1;
					if ((opcodeByte & 0xf0) == 0x40) {
						// another REX prefix, but we only remember the last one
						if (consumeByte(insn, &byte))
							return -1;
					} else
						break;
				}

				insn->rexPrefix = byte;
				insn->necessaryPrefixLocation = insn->readerCursor - 2;
				// dbgprintf(insn, "Found REX prefix 0x%hhx", byte);
			} else {
				unconsumeByte(insn);
				insn->necessaryPrefixLocation = insn->readerCursor - 1;
			}
		} else {
			unconsumeByte(insn);
			insn->necessaryPrefixLocation = insn->readerCursor - 1;
		}
	}

	if (insn->mode == MODE_16BIT) {
		insn->registerSize       = (hasOpSize ? 4 : 2);
		insn->addressSize        = (hasAdSize ? 4 : 2);
		insn->displacementSize   = (hasAdSize ? 4 : 2);
		insn->immediateSize      = (hasOpSize ? 4 : 2);
		insn->immSize = (hasOpSize ? 4 : 2);
	} else if (insn->mode == MODE_32BIT) {
		insn->registerSize       = (hasOpSize ? 2 : 4);
		insn->addressSize        = (hasAdSize ? 2 : 4);
		insn->displacementSize   = (hasAdSize ? 2 : 4);
		insn->immediateSize      = (hasOpSize ? 2 : 4);
		insn->immSize = (hasOpSize ? 2 : 4);
	} else if (insn->mode == MODE_64BIT) {
		if (insn->rexPrefix && wFromREX(insn->rexPrefix)) {
			insn->registerSize       = 8;
			insn->addressSize        = (hasAdSize ? 4 : 8);
			insn->displacementSize   = 4;
			insn->immediateSize      = 4;
			insn->immSize      = 4;
		} else if (insn->rexPrefix) {
			insn->registerSize       = (hasOpSize ? 2 : 4);
			insn->addressSize        = (hasAdSize ? 4 : 8);
			insn->displacementSize   = (hasOpSize ? 2 : 4);
			insn->immediateSize      = (hasOpSize ? 2 : 4);
			insn->immSize      = (hasOpSize ? 2 : 4);
		} else {
			insn->registerSize       = (hasOpSize ? 2 : 4);
			insn->addressSize        = (hasAdSize ? 4 : 8);
			insn->displacementSize   = (hasOpSize ? 2 : 4);
			insn->immediateSize      = (hasOpSize ? 2 : 4);
			insn->immSize      = (hasOpSize ? 4 : 8);
		}
	}

	return 0;
}